

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_scalar_vector.hpp
# Opt level: O3

string_t * __thiscall
cfgfile::
tag_scalar_vector_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
::print(string_t *__return_storage_ptr__,
       tag_scalar_vector_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
       *this,int indent)

{
  pointer pbVar1;
  pointer pcVar2;
  undefined8 *puVar3;
  int iVar4;
  tag_scalar_vector_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
  *ptVar5;
  bool bVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char cVar8;
  undefined8 *puVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v;
  pointer pbVar10;
  string_t value;
  string_t local_90;
  int local_6c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  long local_60;
  tag_scalar_vector_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
  *local_58;
  string_t local_50;
  
  local_68 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_68;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  bVar6 = tag_t<cfgfile::string_trait_t>::is_defined(&this->super_tag_t<cfgfile::string_trait_t>);
  if (bVar6) {
    local_60 = (long)indent;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_90,(char)indent);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_90._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    cVar8 = (char)__return_storage_ptr__;
    std::__cxx11::string::push_back(cVar8);
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,
               (ulong)(this->super_tag_t<cfgfile::string_trait_t>).m_name._M_dataplus._M_p);
    pbVar10 = (this->m_values).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = (this->m_values).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_6c = indent;
    local_58 = this;
    if (pbVar10 != pbVar1) {
      do {
        std::__cxx11::string::push_back(cVar8);
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        pcVar2 = (pbVar10->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,pcVar2,pcVar2 + pbVar10->_M_string_length);
        to_cfgfile_format<cfgfile::string_trait_t>(&local_50,&local_90);
        std::__cxx11::string::operator=((string *)&local_90,(string *)&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_90._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        pbVar10 = pbVar10 + 1;
      } while (pbVar10 != pbVar1);
    }
    ptVar5 = local_58;
    iVar7 = (*(local_58->super_tag_t<cfgfile::string_trait_t>)._vptr_tag_t[2])(local_58);
    iVar4 = local_6c;
    if (*(long *)CONCAT44(extraout_var,iVar7) != ((long *)CONCAT44(extraout_var,iVar7))[1]) {
      std::__cxx11::string::push_back(cVar8);
      iVar7 = (*(ptVar5->super_tag_t<cfgfile::string_trait_t>)._vptr_tag_t[2])(ptVar5);
      puVar9 = *(undefined8 **)CONCAT44(extraout_var_00,iVar7);
      puVar3 = (undefined8 *)((long *)CONCAT44(extraout_var_00,iVar7))[1];
      if (puVar9 != puVar3) {
        do {
          (**(code **)(*(long *)*puVar9 + 0x18))(&local_90,(long *)*puVar9,iVar4 + 1);
          std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)local_90._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
          puVar9 = puVar9 + 1;
        } while (puVar9 != puVar3);
      }
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_90,(char)local_60);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_90._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
    }
    std::__cxx11::string::push_back(cVar8);
    std::__cxx11::string::push_back(cVar8);
  }
  return __return_storage_ptr__;
}

Assistant:

typename Trait::string_t print( int indent = 0 ) const override
	{
		typename Trait::string_t result;

		if( this->is_defined() )
		{
			result.append( typename Trait::string_t( indent,
				const_t< Trait >::c_tab ) );
			result.push_back( const_t< Trait >::c_begin_tag );
			result.append( this->name() );

			for( const T & v : m_values )
			{
				result.push_back( const_t< Trait >::c_space );

				typename Trait::string_t value =
					format_t< T, Trait >::to_string( v );

				value = to_cfgfile_format< Trait >( value );

				result.append( value );
			}

			if( !this->children().empty() )
			{
				result.push_back( const_t< Trait >::c_carriage_return );

				for( const tag_t< Trait > * tag : this->children() )
					result.append( tag->print( indent + 1 ) );

				result.append( typename Trait::string_t( indent,
					const_t< Trait >::c_tab ) );
			}

			result.push_back( const_t< Trait >::c_end_tag );
			result.push_back( const_t< Trait >::c_carriage_return );
		}

		return result;
	}